

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O1

void __thiscall
F2DDrawer::AddPoly(F2DDrawer *this,FTexture *texture,FVector2 *points,int npoints,double originx,
                  double originy,double scalex,double scaley,DAngle *rotation,
                  FDynamicColormap *colormap,int lightlevel)

{
  uchar *puVar1;
  float fVar2;
  double dVar3;
  uint uVar4;
  FSimpleVertex *pFVar5;
  uchar *puVar6;
  uint uVar7;
  FMaterial *pFVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  double local_40;
  double local_38;
  
  pFVar8 = FMaterial::ValidateTexture(texture,false);
  if (pFVar8 != (FMaterial *)0x0) {
    TArray<FSimpleVertex,_FSimpleVertex>::Grow(&this->mVertices,npoints);
    uVar4 = (this->mVertices).Count;
    (this->mVertices).Count = uVar4 + npoints;
    dVar3 = rotation->Degrees;
    sincos(dVar3 * 0.017453292519943295,&local_38,&local_40);
    uVar7 = (uint)((double)((uint)texture->Height * 2) / (texture->Scale).Y);
    fVar11 = (float)(1.0 / ((double)(int)((uVar7 & 1) + ((int)uVar7 >> 1)) * scaley));
    if ((texture->field_0x31 & 0x20) != 0) {
      fVar11 = -fVar11;
    }
    if (0 < npoints) {
      uVar7 = (uint)((double)((uint)texture->Width * 2) / (texture->Scale).X);
      lVar9 = (long)(int)uVar4 * 0x18;
      uVar10 = 0;
      do {
        fVar2 = points[uVar10].Y;
        fVar12 = (-0.5 - (float)originx) + points[uVar10].X;
        fVar13 = (-0.5 - (float)originy) + fVar2;
        fVar14 = fVar12;
        if (dVar3 != 0.0) {
          fVar14 = fVar12 * (float)local_40 - fVar13 * (float)local_38;
          fVar13 = fVar13 * (float)local_40 + fVar12 * (float)local_38;
        }
        pFVar5 = (this->mVertices).Array;
        *(float *)((long)&pFVar5->x + lVar9) = points[uVar10].X;
        *(float *)((long)&pFVar5->z + lVar9) = fVar2;
        *(undefined4 *)((long)&pFVar5->y + lVar9) = 0;
        *(float *)((long)&pFVar5->u + lVar9) =
             fVar14 * (float)(1.0 / ((double)(int)((uVar7 & 1) + ((int)uVar7 >> 1)) * scalex));
        *(float *)((long)&pFVar5->v + lVar9) = fVar13 * fVar11;
        *(undefined4 *)((long)&(pFVar5->color).field_0 + lVar9) = 0xffffffff;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x18;
      } while ((uint)npoints != uVar10);
    }
    TArray<unsigned_char,_unsigned_char>::Grow(&this->mData,0x28);
    uVar7 = (this->mData).Count;
    (this->mData).Count = uVar7 + 0x28;
    puVar6 = (this->mData).Array;
    puVar1 = puVar6 + (int)uVar7;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '(';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    *(uint *)(puVar6 + (long)(int)uVar7 + 8) = uVar4;
    *(int *)(puVar6 + (long)(int)uVar7 + 0xc) = npoints;
    *(FMaterial **)(puVar6 + (long)(int)uVar7 + 0x10) = pFVar8;
    *(int *)(puVar6 + (long)(int)uVar7 + 0x18) = lightlevel;
    *(FDynamicColormap **)(puVar6 + (long)(int)uVar7 + 0x20) = colormap;
    this->mLastLineCmd = -1;
  }
  return;
}

Assistant:

void F2DDrawer::AddPoly(FTexture *texture, FVector2 *points, int npoints,
		double originx, double originy, double scalex, double scaley,
		DAngle rotation, FDynamicColormap *colormap, int lightlevel)
{
	FMaterial *gltexture = FMaterial::ValidateTexture(texture, false);

	if (gltexture == nullptr)
	{
		return;
	}
	DataSimplePoly poly;

	poly.mType = DrawTypePoly;
	poly.mLen = (sizeof(poly) + 7) & ~7;
	poly.mTexture = gltexture;
	poly.mColormap = colormap;
	poly.mLightLevel = lightlevel;
	poly.mVertCount = npoints;
	poly.mVertIndex = (int)mVertices.Reserve(npoints);

	bool dorotate = rotation != 0;

	float cosrot = cos(rotation.Radians());
	float sinrot = sin(rotation.Radians());

	float uscale = float(1.f / (texture->GetScaledWidth() * scalex));
	float vscale = float(1.f / (texture->GetScaledHeight() * scaley));
	if (texture->bHasCanvas)
	{
		vscale = 0 - vscale;
	}
	float ox = float(originx);
	float oy = float(originy);

	for (int i = 0; i < npoints; ++i)
	{
		float u = points[i].X - 0.5f - ox;
		float v = points[i].Y - 0.5f - oy;
		if (dorotate)
		{
			float t = u;
			u = t * cosrot - v * sinrot;
			v = v * cosrot + t * sinrot;
		}
		mVertices[poly.mVertIndex+i].Set(points[i].X, points[i].Y, 0, u*uscale, v*vscale);
	}
	AddData(&poly);
}